

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O3

void __thiscall duckdb::ZSTDCompressionState::ResetOutBuffer(ZSTDCompressionState *this)

{
  BlockManager *pBVar1;
  BufferHandle *pBVar2;
  idx_t iVar3;
  idx_t iVar4;
  
  pBVar1 = (this->super_CompressionState).info.block_manager;
  (this->out_buffer).dst = this->current_buffer_ptr;
  (this->out_buffer).pos = 0;
  iVar3 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar4 = optional_idx::GetIndex(&pBVar1->block_header_size);
  optional_ptr<duckdb::BufferHandle,_true>::CheckValid(&this->current_buffer);
  pBVar2 = (this->current_buffer).ptr;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&pBVar2->node);
  (this->out_buffer).size =
       (iVar3 - ((uint)(*(int *)&this->current_buffer_ptr - *(int *)&((pBVar2->node).ptr)->buffer) +
                iVar4)) - 8;
  return;
}

Assistant:

void ResetOutBuffer() {
		out_buffer.dst = current_buffer_ptr;
		out_buffer.pos = 0;

		auto remaining_space = info.GetBlockSize() - GetCurrentOffset() - sizeof(block_id_t);
		out_buffer.size = remaining_space;
	}